

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O3

optional<tinyusdz::Orientation> *
tinyusdz::OrientationFromString(optional<tinyusdz::Orientation> *__return_storage_ptr__,string *v)

{
  int iVar1;
  
  iVar1 = ::std::__cxx11::string::compare((char *)v);
  if (iVar1 == 0) {
    __return_storage_ptr__->has_value_ = true;
  }
  else {
    iVar1 = ::std::__cxx11::string::compare((char *)v);
    if (iVar1 == 0) {
      __return_storage_ptr__->has_value_ = true;
      __return_storage_ptr__->contained = (storage_t<tinyusdz::Orientation>)0x1;
      return __return_storage_ptr__;
    }
    __return_storage_ptr__->has_value_ = false;
  }
  __return_storage_ptr__->contained = (storage_t<tinyusdz::Orientation>)0x0;
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<Orientation> OrientationFromString(const std::string &v) {
  if ("rightHanded" == v) {
    return Orientation::RightHanded;
  } else if ("leftHanded" == v) {
    return Orientation::LeftHanded;
  }
  return nonstd::nullopt;
}